

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerImpl::Init
          (Error *__return_storage_ptr__,CommissionerImpl *this,Config *aConfig)

{
  string *this_00;
  ErrorCode EVar1;
  undefined3 uVar2;
  uint32_t uVar3;
  int iVar4;
  shared_ptr<ot::commissioner::Logger> local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  char local_a8 [32];
  pointer local_88;
  pointer local_70;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_c8 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_c8;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  ValidateConfig((Error *)local_c0,aConfig);
  __return_storage_ptr__->mCode = local_c0._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_b8);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  if (EVar1 == kNone) {
    (this->mConfig).mMaxConnectionNum = aConfig->mMaxConnectionNum;
    uVar2 = *(undefined3 *)&aConfig->field_0x1;
    uVar3 = aConfig->mKeepAliveInterval;
    (this->mConfig).mEnableCcm = aConfig->mEnableCcm;
    *(undefined3 *)&(this->mConfig).field_0x1 = uVar2;
    (this->mConfig).mKeepAliveInterval = uVar3;
    (this->mConfig).mLogger.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (aConfig->mLogger).
              super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->mConfig).mLogger.
                super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&(aConfig->mLogger).
                 super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    (this->mConfig).mEnableDtlsDebugLogging = aConfig->mEnableDtlsDebugLogging;
    std::__cxx11::string::_M_assign((string *)&(this->mConfig).mDomainName);
    std::__cxx11::string::_M_assign((string *)&(this->mConfig).mId);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->mConfig).mPSKc,&aConfig->mPSKc);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->mConfig).mPrivateKey,&aConfig->mPrivateKey);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->mConfig).mCertificate,&aConfig->mCertificate);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->mConfig).mTrustAnchor,&aConfig->mTrustAnchor);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->mConfig).mCommissionerToken,&aConfig->mCommissionerToken);
    std::__cxx11::string::_M_assign((string *)&(this->mConfig).mThreadSMRoot);
    local_d8.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (aConfig->mLogger).super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_d8.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (aConfig->mLogger).
            super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    if (local_d8.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d8.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_d8.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d8.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_d8.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    InitLogger(&local_d8);
    if (local_d8.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super___shared_ptr<ot::commissioner::Logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    LoggingConfig(this);
    GetDtlsConfig((DtlsConfig *)local_c0,&this->mConfig);
    DtlsSession::Init((Error *)local_58,&(this->mBrClient).mDtlsSession,(DtlsConfig *)local_c0);
    __return_storage_ptr__->mCode = local_58._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    if (local_70 != (pointer)0x0) {
      operator_delete(local_70);
    }
    if (local_88 != (pointer)0x0) {
      operator_delete(local_88);
    }
    if ((void *)local_a8._8_8_ != (void *)0x0) {
      operator_delete((void *)local_a8._8_8_);
    }
    if (local_b8._M_p != (char *)0x0) {
      operator_delete(local_b8._M_p);
    }
    if (EVar1 == kNone) {
      iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
      if ((char)iVar4 != '\0') {
        TokenManager::Init((Error *)local_c0,&this->mTokenManager,&this->mConfig);
        __return_storage_ptr__->mCode = local_c0._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_b8);
        if (local_b8._M_p != local_a8) {
          operator_delete(local_b8._M_p);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::Init(const Config &aConfig)
{
    Error error;

    SuccessOrExit(error = ValidateConfig(aConfig));
    mConfig = aConfig;

    InitLogger(aConfig.mLogger);
    LoggingConfig();

    SuccessOrExit(error = mBrClient.Init(GetDtlsConfig(mConfig)));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        // It is not good to leave the token manager uninitialized in non-CCM mode.
        // TODO(wgtdkp): create TokenManager only in CCM Mode.
        SuccessOrExit(error = mTokenManager.Init(mConfig));
    }
#endif

exit:
    return error;
}